

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

void __thiscall BigInt::operator=(BigInt *this,BigInt *b)

{
  int iVar1;
  string value;
  string local_78;
  string local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  iVar1 = b->sign;
  to_string_abi_cxx11_(&local_78,b);
  if (iVar1 != 0) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)&local_78);
    std::__cxx11::string::operator=((string *)&local_78,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  set_number(this,&local_58,iVar1 == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BigInt::operator=(BigInt b) {
    bool positive = b.sign == 0 ? true : false;
    string value = b.to_string();
    if (positive == false) {
        value = value.substr(1);
    }
    this->set_number(value, positive);
}